

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

JavascriptString *
Js::JavascriptString::RepeatCore
          (JavascriptString *currentString,charcount_t count,ScriptContext *scriptContext)

{
  char16 cVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  char16 *src;
  Recycler *this;
  char16_t *content;
  JavascriptString *pJVar7;
  ulong uVar8;
  ulong uVar9;
  char16_t *dst;
  size_t count_00;
  undefined1 local_78 [8];
  TrackAllocData data;
  
  if (currentString == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xa34,"(currentString != nullptr)","currentString != nullptr");
    if (!bVar4) goto LAB_00bc01ef;
    *puVar6 = 0;
  }
  if (currentString->m_charLength == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xa35,"(currentString->GetLength() > 0)",
                                "currentString->GetLength() > 0");
    if (!bVar4) goto LAB_00bc01ef;
    *puVar6 = 0;
  }
  if (count == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xa36,"(count > 0)","count > 0");
    if (!bVar4) goto LAB_00bc01ef;
    *puVar6 = 0;
  }
  src = GetString(currentString);
  uVar2 = currentString->m_charLength;
  uVar8 = (ulong)uVar2;
  uVar9 = count * uVar8;
  uVar5 = (uint)uVar9;
  if (((int)(uVar9 >> 0x20) != 0) || (uVar9 = uVar9 & 0xffffffff, 0x7ffffffe < uVar5)) {
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5e9da,(PCWSTR)0x0);
  }
  count_00 = (size_t)(uVar5 + 1);
  local_78 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_7ec8d8c;
  data.filename._0_4_ = 0xa43;
  data.plusSize = count_00;
  this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_78);
  content = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                      ((Memory *)this,(Recycler *)Memory::Recycler::AllocLeaf,0,count_00);
  data._32_8_ = uVar9;
  if (uVar2 == 1) {
    cVar1 = *src;
    uVar8 = uVar9;
    while (bVar4 = uVar8 != 0, uVar8 = uVar8 - 1, bVar4) {
      content[uVar8] = cVar1;
    }
    dst = content + uVar9;
  }
  else {
    dst = content;
    if (uVar5 < uVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0xa4e,"(bufferDstSize > currentLength)",
                                  "bufferDstSize > currentLength");
      if (!bVar4) goto LAB_00bc01ef;
      *puVar6 = 0;
    }
    while (bVar4 = count != 0, count = count - 1, bVar4) {
      js_wmemcpy_s(dst,count_00,src,uVar8);
      count_00 = count_00 - uVar8;
      dst = dst + uVar8;
    }
    if (count_00 != 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0xa56,"(bufferDstSize == 1)","bufferDstSize == 1");
      if (!bVar4) {
LAB_00bc01ef:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
  }
  *dst = L'\0';
  pJVar7 = NewWithBufferT<Js::LiteralString,false>(content,data.line,scriptContext);
  return pJVar7;
}

Assistant:

JavascriptString* JavascriptString::RepeatCore(JavascriptString* currentString, charcount_t count, ScriptContext* scriptContext)
    {
        Assert(currentString != nullptr);
        Assert(currentString->GetLength() > 0);
        Assert(count > 0);

        const char16* currentRawString = currentString->GetString();
        charcount_t currentLength = currentString->GetLength();

        charcount_t finalBufferCount = 0;
        bool hasOverflow = UInt32Math::Mul(count, currentLength, &finalBufferCount);
        if (hasOverflow || !IsValidCharCount(finalBufferCount))
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_OutOfBoundString);
        }
        finalBufferCount = finalBufferCount + 1;

        char16* buffer = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, finalBufferCount);

        if (currentLength == 1)
        {
            wmemset(buffer, currentRawString[0], finalBufferCount - 1);
            buffer[finalBufferCount - 1] = '\0';
        }
        else
        {
            char16* bufferDst = buffer;
            size_t bufferDstSize = finalBufferCount;
            AnalysisAssert(bufferDstSize > currentLength);

            for (charcount_t i = 0; i < count; i += 1)
            {
                js_wmemcpy_s(bufferDst, bufferDstSize, currentRawString, currentLength);
                bufferDst += currentLength;
                bufferDstSize -= currentLength;
            }
            Assert(bufferDstSize == 1);
            *bufferDst = '\0';
        }

        return JavascriptString::NewWithBuffer(buffer, finalBufferCount - 1, scriptContext);
    }